

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_kwp.c
# Opt level: O1

err_t beltKWPUnwrap(octet *dest,octet *src,size_t count,octet *header,octet *key,size_t len)

{
  size_t count_00;
  bool_t bVar1;
  size_t sVar2;
  blob_t state;
  void *dest_00;
  err_t eVar3;
  
  if (count < 0x20) {
    return 0x6d;
  }
  if (0x20 < len) {
    return 0x6d;
  }
  if ((0x101010000U >> (len & 0x3f) & 1) == 0) {
    return 0x6d;
  }
  bVar1 = memIsValid(src,count);
  if (bVar1 == 0) {
    return 0x6d;
  }
  if ((header != (octet *)0x0) && (bVar1 = memIsValid(header,0x10), bVar1 == 0)) {
    return 0x6d;
  }
  bVar1 = memIsValid(key,len);
  if (bVar1 == 0) {
    return 0x6d;
  }
  count_00 = count - 0x10;
  bVar1 = memIsValid(dest,count_00);
  if (bVar1 == 0) {
    return 0x6d;
  }
  sVar2 = beltWBL_keep();
  state = blobCreate(sVar2 + 0x10);
  if (state == (blob_t)0x0) {
    return 0x6e;
  }
  sVar2 = beltWBL_keep();
  dest_00 = (void *)(sVar2 + (long)state);
  beltWBLStart(state,key,len);
  memCopy(dest_00,src + (count - 0x10),0x10);
  memMove(dest,src,count_00);
  beltWBLStepD2(dest,dest_00,count,state);
  if (header == (octet *)0x0) {
LAB_0013319d:
    bVar1 = memIsZero(dest_00,0x10);
    eVar3 = 0;
    if (bVar1 != 0) goto LAB_001331c6;
  }
  else {
    bVar1 = memEq(header,dest_00,0x10);
    if (bVar1 != 0) {
      eVar3 = 0;
      if (header != (octet *)0x0) goto LAB_001331c6;
      goto LAB_0013319d;
    }
  }
  memSet(dest,'\0',count_00);
  eVar3 = 0x201;
LAB_001331c6:
  blobClose(state);
  return eVar3;
}

Assistant:

err_t beltKWPUnwrap(octet dest[], const octet src[], size_t count,
	const octet header[16], const octet key[], size_t len)
{
	void* state;
	octet* header2;
	// проверить входные данные
	if (count < 32 ||
		len != 16 && len != 24 && len != 32 ||
		!memIsValid(src, count) ||
		!memIsNullOrValid(header, 16) ||
		!memIsValid(key, len) ||
		!memIsValid(dest, count - 16))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(beltKWP_keep() + 16);
	if (state == 0)
		return ERR_OUTOFMEMORY;
	header2 = (octet*)state + beltKWP_keep();
	// снять защиту
	beltKWPStart(state, key, len);
	memCopy(header2, src + count - 16, 16);
	memMove(dest, src, count - 16);
	beltKWPStepD2(dest, header2, count, state);
	if (header && !memEq(header, header2, 16) ||
		header == 0 && !memIsZero(header2, 16))
	{
		memSetZero(dest, count - 16);
		blobClose(state);
		return ERR_BAD_KEYTOKEN;
	}
	// завершить
	blobClose(state);
	return ERR_OK;
}